

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

int despot::Variable::ComputeCurrentIndex
              (vector<despot::Variable_*,_std::allocator<despot::Variable_*>_> *vars)

{
  Variable *this;
  int iVar1;
  size_type sVar2;
  const_reference ppVVar3;
  Variable *var;
  int i;
  int index;
  vector<despot::Variable_*,_std::allocator<despot::Variable_*>_> *vars_local;
  
  var._4_4_ = 0;
  var._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::Variable_*,_std::allocator<despot::Variable_*>_>::size(vars);
    if (sVar2 <= (ulong)(long)(int)var) break;
    ppVVar3 = std::vector<despot::Variable_*,_std::allocator<despot::Variable_*>_>::operator[]
                        (vars,(long)(int)var);
    this = *ppVVar3;
    iVar1 = Size(this);
    var._4_4_ = var._4_4_ * iVar1 + this->curr_value;
    var._0_4_ = (int)var + 1;
  }
  return var._4_4_;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<Variable*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		Variable* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}